

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

uint32 __thiscall Clasp::Asp::PrgBody::scc(PrgBody *this,LogicProgram *prg)

{
  long lVar1;
  uint uVar2;
  pointer ppPVar3;
  PrgDisj *pPVar4;
  head_iterator pPVar5;
  long lVar6;
  pointer *pppPVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Head *pHVar11;
  pointer *pppPVar12;
  bool bVar13;
  Var head;
  uint local_3c;
  pointer local_38;
  
  uVar2 = *(uint *)&this->field_0x8;
  lVar6 = 0;
  bVar13 = false;
  uVar10 = 0;
  while ((uVar8 = uVar2 & 0x1ffffff, (uVar2 & 0x1ffffff) != (uint)lVar6 &&
         (uVar9 = *(uint *)(&(&this[1].super_PrgNode)[(uVar2 & 0x18000000) != 0].field_0x0 +
                           lVar6 * 4), uVar8 = (uint)lVar6, (uVar9 & 2) == 0))) {
    uVar8 = *(uint *)&((prg->atoms_).ebo_.buf[uVar9 >> 2]->super_PrgHead).field_0x18;
    uVar9 = uVar8 & 0x7ffffff;
    if (uVar9 != 0x7ffffff) {
      uVar10 = uVar10 | 1L << ((ulong)uVar8 & 0x3f);
      bVar13 = (bool)(bVar13 | 0x3f < uVar9);
    }
    lVar6 = lVar6 + 1;
  }
  if (uVar10 != 0) {
    pHVar11 = &this->headData_;
    if ((~uVar2 & 0x6000000) == 0) {
      pHVar11 = (Head *)(pHVar11->ext->ebo_).buf;
    }
    pPVar5 = heads_end(this);
    ppPVar3 = (prg->atoms_).ebo_.buf;
    local_38 = (prg->disjunctions_).ebo_.buf;
    for (; pHVar11 != (Head *)pPVar5; pHVar11 = (Head *)((long)pHVar11 + 4)) {
      local_3c = *(uint32 *)pHVar11 >> 4;
      if ((*(uint32 *)pHVar11 & 0xc) == 0) {
        pppPVar7 = (pointer *)&local_3c;
        pppPVar12 = &local_38;
      }
      else {
        pPVar4 = local_38[local_3c];
        pppPVar7 = (pointer *)&(pPVar4->super_PrgHead).field_0x1c;
        pppPVar12 = (pointer *)
                    (&(pPVar4->super_PrgHead).field_0x1c +
                    (ulong)(*(uint *)&(pPVar4->super_PrgHead).field_0x18 & 0x7ffffff) * 4);
      }
      for (; pppPVar7 != pppPVar12; pppPVar7 = (pointer *)((long)pppPVar7 + 4)) {
        uVar2 = *(uint *)&(ppPVar3[*(uint *)pppPVar7]->super_PrgHead).field_0x18;
        uVar9 = uVar2 & 0x7ffffff;
        if ((uVar9 != 0x7ffffff) && ((uVar10 >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
          if (!bVar13) {
            return uVar9;
          }
          lVar6 = 0;
          while (uVar8 != (uint)lVar6) {
            lVar1 = lVar6 * 4;
            lVar6 = lVar6 + 1;
            if (uVar9 == (*(uint *)&(ppPVar3[*(uint *)(&(&this[1].super_PrgNode)
                                                        [(this->field_0xb & 0x18) != 0].field_0x0 +
                                                      lVar1) >> 2]->super_PrgHead).field_0x18 &
                         0x7ffffff)) {
              return uVar9;
            }
          }
        }
      }
    }
  }
  return 0x7ffffff;
}

Assistant:

uint32 PrgBody::scc(const LogicProgram& prg) const {
	uint64 sccMask = 0;
	uint32 end     = size();
	uint32 scc     = PrgNode::noScc;
	bool   large   = false;
	for (uint32 i  = 0; i != end; ++i) {
		if      (goal(i).sign()) {
			end = i;
			break;
		}
		else if ((scc = prg.getAtom(goal(i).var())->scc()) != PrgNode::noScc) {
			sccMask |= uint64(1) << (scc & 63);
			large   |= scc > 63;
		}
	}
	if (sccMask != 0) {
		PrgDisj::atom_iterator aIt = 0, aEnd = 0;
		Var head;
		for (head_iterator h = heads_begin(), hEnd = heads_end(); h != hEnd; ++h) {
			if (h->isAtom()) { head = h->node(); aIt = &head, aEnd = aIt + 1; }
			else             { PrgDisj* d = prg.getDisj(h->node()); aIt = d->begin(), aEnd = d->end(); }
			for (; aIt != aEnd; ++aIt) {
				scc = prg.getAtom(*aIt)->scc();
				if (scc != PrgNode::noScc && (sccMask & (uint64(1) << (scc&63))) != 0) {
					if (!large) { return scc; }
					for (uint32 j = 0; j != end; ++j) {
						if (scc == prg.getAtom(goal(j).var())->scc()) { return scc; }
					}
				}
			}
		}
	}
	return PrgNode::noScc;
}